

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo::InternalSwap(GeneratedCodeInfo *this,GeneratedCodeInfo *other)

{
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  void *pvVar5;
  UnknownFieldSet *pUVar6;
  UnknownFieldSet *pUVar7;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->annotation_).super_RepeatedPtrFieldBase,
             &(other->annotation_).super_RepeatedPtrFieldBase);
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar3 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_00307beb;
LAB_00307bd3:
    pUVar7 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_00307bd3;
    pUVar7 = internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(other->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
    pvVar5 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar5 & 1) == 0) {
    pUVar6 = internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar6 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  pvVar4 = pUVar6->fields_;
  pUVar6->fields_ = pUVar7->fields_;
  pUVar7->fields_ = pvVar4;
LAB_00307beb:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void GeneratedCodeInfo::InternalSwap(GeneratedCodeInfo* other) {
  annotation_.InternalSwap(&other->annotation_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}